

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitStore(BinaryInstWriter *this,Store *curr)

{
  uint8_t uVar1;
  U32LEB x;
  int8_t x_00;
  BasicType BVar2;
  BufferWithRandomAccess *pBVar3;
  
  if (curr->isAtomic == false) {
    BVar2 = wasm::Type::getBasic(&curr->valueType);
    switch(BVar2) {
    case none:
    case unreachable:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x18c);
    case i32:
      uVar1 = curr->bytes;
      if (uVar1 == '\x04') {
        pBVar3 = this->o;
        x_00 = '6';
      }
      else if (uVar1 == '\x02') {
        pBVar3 = this->o;
        x_00 = ';';
      }
      else {
        if (uVar1 != '\x01') goto switchD_00cea537_caseD_3;
        pBVar3 = this->o;
        x_00 = ':';
      }
      break;
    case i64:
      switch(curr->bytes) {
      case '\x01':
        pBVar3 = this->o;
        x_00 = '<';
        break;
      case '\x02':
        pBVar3 = this->o;
        x_00 = '=';
        break;
      default:
switchD_00cea537_caseD_3:
        abort();
      case '\x04':
        pBVar3 = this->o;
        x_00 = '>';
        break;
      case '\b':
        pBVar3 = this->o;
        x_00 = '7';
      }
      break;
    case f32:
      if (curr->bytes != '\x04') {
        if (curr->bytes != '\x02') {
          handle_unreachable("invalid store size",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                             ,0x17f);
        }
        pBVar3 = BufferWithRandomAccess::operator<<(this->o,-4);
        x.value = 0x31;
        goto LAB_00cea575;
      }
      pBVar3 = this->o;
      x_00 = '8';
      break;
    case f64:
      pBVar3 = this->o;
      x_00 = '9';
      break;
    case v128:
      pBVar3 = BufferWithRandomAccess::operator<<(this->o,-3);
      x.value = 0xb;
LAB_00cea575:
      BufferWithRandomAccess::operator<<(pBVar3,x);
    default:
      goto switchD_00cea4c1_default;
    }
  }
  else {
    BufferWithRandomAccess::operator<<(this->o,-2);
    BVar2 = wasm::Type::getBasic(&curr->valueType);
    if (BVar2 == i64) {
      switch(curr->bytes) {
      case '\x01':
        pBVar3 = this->o;
        x_00 = '\x1b';
        break;
      case '\x02':
        pBVar3 = this->o;
        x_00 = '\x1c';
        break;
      default:
        handle_unreachable("invalid store size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1b0);
      case '\x04':
        pBVar3 = this->o;
        x_00 = '\x1d';
        break;
      case '\b':
        pBVar3 = this->o;
        x_00 = '\x18';
      }
    }
    else {
      if (BVar2 != i32) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x1b5);
      }
      uVar1 = curr->bytes;
      if (uVar1 == '\x04') {
        pBVar3 = this->o;
        x_00 = '\x17';
      }
      else if (uVar1 == '\x02') {
        pBVar3 = this->o;
        x_00 = '\x1a';
      }
      else {
        if (uVar1 != '\x01') {
          handle_unreachable("invalid store size",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                             ,0x19d);
        }
        pBVar3 = this->o;
        x_00 = '\x19';
      }
    }
  }
  BufferWithRandomAccess::operator<<(pBVar3,x_00);
switchD_00cea4c1_default:
  emitMemoryAccess(this,(curr->align).addr,(ulong)curr->bytes,(curr->offset).addr,
                   (Name)(curr->memory).super_IString.str);
  return;
}

Assistant:

void BinaryInstWriter::visitStore(Store* curr) {
  if (!curr->isAtomic) {
    switch (curr->valueType.getBasic()) {
      case Type::i32: {
        switch (curr->bytes) {
          case 1:
            o << int8_t(BinaryConsts::I32StoreMem8);
            break;
          case 2:
            o << int8_t(BinaryConsts::I32StoreMem16);
            break;
          case 4:
            o << int8_t(BinaryConsts::I32StoreMem);
            break;
          default:
            abort();
        }
        break;
      }
      case Type::i64: {
        switch (curr->bytes) {
          case 1:
            o << int8_t(BinaryConsts::I64StoreMem8);
            break;
          case 2:
            o << int8_t(BinaryConsts::I64StoreMem16);
            break;
          case 4:
            o << int8_t(BinaryConsts::I64StoreMem32);
            break;
          case 8:
            o << int8_t(BinaryConsts::I64StoreMem);
            break;
          default:
            abort();
        }
        break;
      }
      case Type::f32: {
        switch (curr->bytes) {
          case 2:
            o << int8_t(BinaryConsts::MiscPrefix)
              << U32LEB(BinaryConsts::F32_F16StoreMem);
            break;
          case 4:
            o << int8_t(BinaryConsts::F32StoreMem);
            break;
          default:
            WASM_UNREACHABLE("invalid store size");
        }
        break;
      }
      case Type::f64:
        o << int8_t(BinaryConsts::F64StoreMem);
        break;
      case Type::v128:
        o << int8_t(BinaryConsts::SIMDPrefix)
          << U32LEB(BinaryConsts::V128Store);
        break;
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  } else {
    o << int8_t(BinaryConsts::AtomicPrefix);
    switch (curr->valueType.getBasic()) {
      case Type::i32: {
        switch (curr->bytes) {
          case 1:
            o << int8_t(BinaryConsts::I32AtomicStore8);
            break;
          case 2:
            o << int8_t(BinaryConsts::I32AtomicStore16);
            break;
          case 4:
            o << int8_t(BinaryConsts::I32AtomicStore);
            break;
          default:
            WASM_UNREACHABLE("invalid store size");
        }
        break;
      }
      case Type::i64: {
        switch (curr->bytes) {
          case 1:
            o << int8_t(BinaryConsts::I64AtomicStore8);
            break;
          case 2:
            o << int8_t(BinaryConsts::I64AtomicStore16);
            break;
          case 4:
            o << int8_t(BinaryConsts::I64AtomicStore32);
            break;
          case 8:
            o << int8_t(BinaryConsts::I64AtomicStore);
            break;
          default:
            WASM_UNREACHABLE("invalid store size");
        }
        break;
      }
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  emitMemoryAccess(curr->align, curr->bytes, curr->offset, curr->memory);
}